

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void __thiscall
spatial_region::film
          (spatial_region *this,double x0,double x1,double ne_y0,double ne_y1,int ions,double cmr,
          double gradwidth,double y0,double y1,double z0,double z1,double T,double vx,
          bool is_profiled,int xnpic_film,int ynpic_film,int znpic_film,
          bool append_for_moving_window,double gradwidth_y)

{
  int iVar1;
  double T_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined7 in_register_00000011;
  int iVar17;
  int i;
  int iVar18;
  ulong uVar19;
  int iVar20;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar21;
  double dVar22;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double cmr_00;
  undefined1 in_register_00001208 [56];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar45 [64];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 in_XMM11_Qb;
  int_vector3d local_110;
  int_vector3d local_104;
  double local_f8;
  double dStack_f0;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined4 local_ac;
  undefined1 local_a8 [16];
  double local_98;
  ulong local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar46._8_56_ = in_register_000012c8;
  auVar46._0_8_ = ne_y1;
  auVar45._8_56_ = in_register_00001288;
  auVar45._0_8_ = ne_y0;
  auVar32._8_56_ = in_register_00001208;
  auVar32._0_8_ = x0;
  local_ac = (undefined4)CONCAT71(in_register_00000011,is_profiled);
  uVar13 = (uint)(x1 / this->dx);
  if (append_for_moving_window) {
    uVar19 = (ulong)(this->nx - 3);
    uVar16 = this->nx - 2;
    local_90 = (ulong)uVar16;
    if ((int)uVar13 < (int)uVar16) {
      local_90 = uVar19;
    }
  }
  else {
    uVar15 = (uint)(x0 / this->dx);
    uVar15 = ~((int)uVar15 >> 0x1f) & uVar15;
    uVar16 = this->nx;
    uVar13 = ~((int)uVar13 >> 0x1f) & uVar13;
    if ((int)uVar16 <= (int)uVar15) {
      uVar15 = uVar16;
    }
    uVar19 = (ulong)uVar15;
    local_90 = (ulong)uVar16;
    if ((int)uVar13 < (int)uVar16) {
      local_90 = (ulong)uVar13;
    }
  }
  if ((int)uVar19 < (int)local_90) {
    dVar21 = this->dy;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = vx;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = z1;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = z0;
    local_c8 = T * cmr;
    auVar48 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar48,auVar48);
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    local_a8 = vxorpd_avx512vl(auVar32._0_16_,auVar11);
    local_98 = auVar48._0_8_;
    local_80 = x0 + gradwidth;
    local_68 = (double)(((int)(y1 / dVar21) - (int)(y0 / dVar21)) + -3);
    local_88 = x0 - gradwidth;
    local_58 = vunpcklpd_avx(auVar46._0_16_,auVar45._0_16_);
    local_48 = vunpcklpd_avx(auVar47,auVar49);
    auVar48 = vsqrtsd_avx(auVar48,auVar48);
    local_70 = auVar48._0_8_;
    local_110.i = xnpic_film;
    local_110.j = ynpic_film;
    local_110.k = znpic_film;
    local_e0 = gradwidth;
    local_d0 = cmr;
    local_c0 = y0;
    local_b8 = y1;
    dStack_60 = local_68;
    do {
      iVar1 = (int)(local_c0 / dVar21) + 1;
      iVar14 = (int)(local_b8 / dVar21);
      iVar18 = (int)uVar19;
      if (iVar1 < iVar14 + -1) {
        local_d8 = (double)iVar18;
        dVar22 = this->dz;
        iVar20 = (int)(local_c0 / dVar21);
        do {
          auVar41._8_8_ = dVar22;
          auVar41._0_8_ = dVar22;
          auVar48 = vdivpd_avx(local_48,auVar41);
          auVar42._0_4_ = (int)auVar48._0_8_;
          auVar42._4_4_ = (int)auVar48._8_8_;
          auVar42._8_8_ = 0;
          auVar48 = vpaddd_avx(auVar42,_DAT_001376b0);
          iVar17 = auVar48._0_4_;
          if (iVar17 < auVar48._4_4_) {
            auVar48 = vpinsrd_avx(ZEXT416((uint)(iVar20 - (int)(local_c0 / dVar21))),
                                  (iVar14 - iVar20) + -3,1);
            auVar48 = vcvtdq2pd_avx(auVar48);
            auVar23._0_8_ = auVar48._0_8_ * (double)local_58._0_8_;
            auVar23._8_8_ = auVar48._8_8_ * (double)local_58._8_8_;
            auVar12._8_8_ = dStack_60;
            auVar12._0_8_ = local_68;
            auVar48 = vdivpd_avx(auVar23,auVar12);
            local_f8 = auVar48._0_8_ + auVar48._8_8_;
            dStack_f0 = auVar48._0_8_ + auVar48._8_8_;
            local_78 = (double)iVar1;
            do {
              if ((char)local_ac != '\0') {
                auVar24._8_8_ = 0;
                auVar24._0_8_ = this->dy;
                dVar21 = this->dy * (double)this->ny * 0.5;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = local_78;
                auVar33._8_8_ = 0;
                auVar33._0_8_ = dVar21;
                auVar48 = vfmsub132sd_fma(auVar24,auVar33,auVar2);
                dVar21 = auVar48._0_8_ / dVar21;
                dVar22 = cos(dVar21 * dVar21 * dVar21 * dVar21 * dVar21 * 1.5707963267948966);
                auVar34._0_8_ = (double)iVar17;
                auVar34._8_8_ = in_XMM11_Qb;
                auVar25._8_8_ = 0;
                auVar25._0_8_ = this->dz;
                dVar21 = this->dz * (double)this->nz * 0.5;
                auVar43._8_8_ = 0;
                auVar43._0_8_ = dVar21;
                auVar48 = vfmsub213sd_fma(auVar34,auVar25,auVar43);
                dVar21 = auVar48._0_8_ / dVar21;
                dVar21 = cos(dVar21 * dVar21 * dVar21 * dVar21 * dVar21 * 1.5707963267948966);
                local_f8 = local_f8 * dVar21 * dVar21 * dVar22 * dVar22;
                dStack_f0 = 0.0;
              }
              if (0.0 <= gradwidth_y) {
                dVar21 = this->dy;
                auVar44._0_8_ = (double)(iVar20 - (int)(local_c0 / dVar21));
                auVar44._8_8_ = in_XMM11_Qb;
                auVar26._0_8_ = gradwidth_y / dVar21;
                auVar26._8_8_ = 0;
                uVar9 = vcmpsd_avx512f(auVar44,auVar26,1);
                bVar10 = (bool)((byte)uVar9 & 1);
                local_f8 = (double)((ulong)bVar10 *
                                    (long)(local_f8 * (auVar44._0_8_ / auVar26._0_8_)) +
                                   (ulong)!bVar10 * (long)local_f8);
                dVar21 = (double)(((int)(local_b8 / dVar21) - iVar20) + -3);
                if (dVar21 < auVar26._0_8_) {
                  local_f8 = (dVar21 / auVar26._0_8_) * local_f8;
                  dStack_f0 = 0.0;
                }
              }
              dVar21 = local_70;
              local_104.i = iVar18;
              local_104.j = iVar1;
              local_104.k = iVar17;
              if (local_98 < 0.0) {
                dVar21 = sqrt(local_98);
              }
              dVar21 = vx / dVar21;
              dVar22 = this->dx;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = dVar22;
              if (0.0 <= local_e0) {
                if ((int)(local_80 / dVar22) <= iVar18) goto LAB_00112ff8;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = local_d8;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_a8._0_8_;
                auVar48 = vfmadd213sd_fma(auVar27,auVar37,auVar5);
                fill_cell_by_particles
                          (this,-1.0,&local_104,&local_110,(auVar48._0_8_ * local_f8) / local_e0,
                           dVar21,0.0,0.0,T);
                if (ions == 2) {
                  auVar31._8_8_ = 0;
                  auVar31._0_8_ = this->dx;
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = local_d8;
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = local_a8._0_8_;
                  auVar48 = vfmadd213sd_fma(auVar31,auVar40,auVar8);
                  dVar22 = (auVar48._0_8_ * local_f8) / local_e0;
                  goto LAB_001130ed;
                }
                if (ions == 1) {
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ = this->dx;
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = local_d8;
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_a8._0_8_;
                  auVar48 = vfmadd213sd_fma(auVar29,auVar38,auVar6);
                  dVar22 = (auVar48._0_8_ * local_f8) / local_e0;
                  T_00 = local_c8;
                  cmr_00 = local_d0;
                  goto LAB_00113105;
                }
              }
              else if (iVar18 < (int)(local_88 / dVar22)) {
                auVar35._8_8_ = 0;
                auVar35._0_8_ = local_d8;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = local_a8._0_8_;
                auVar48 = vfmadd213sd_fma(auVar27,auVar35,auVar3);
                fill_cell_by_particles
                          (this,-1.0,&local_104,&local_110,
                           (auVar48._0_8_ / local_e0 + 1.0) * local_f8,dVar21,0.0,0.0,T);
                if (ions == 2) {
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = this->dx;
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = local_d8;
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = local_a8._0_8_;
                  auVar48 = vfmadd213sd_fma(auVar30,auVar39,auVar7);
                  dVar22 = (auVar48._0_8_ / local_e0 + 1.0) * local_f8;
LAB_001130ed:
                  T_00 = T;
                  cmr_00 = 1.0;
                }
                else {
                  if (ions != 1) goto LAB_0011310a;
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = this->dx;
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = local_d8;
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = local_a8._0_8_;
                  auVar48 = vfmadd213sd_fma(auVar28,auVar36,auVar4);
                  dVar22 = (auVar48._0_8_ / local_e0 + 1.0) * local_f8;
                  T_00 = local_c8;
                  cmr_00 = local_d0;
                }
LAB_00113105:
                fill_cell_by_particles(this,cmr_00,&local_104,&local_110,dVar22,dVar21,0.0,0.0,T_00)
                ;
              }
              else {
LAB_00112ff8:
                fill_cell_by_particles(this,-1.0,&local_104,&local_110,local_f8,dVar21,0.0,0.0,T);
                dVar22 = local_f8;
                if (ions == 2) goto LAB_001130ed;
                T_00 = local_c8;
                cmr_00 = local_d0;
                if (ions == 1) goto LAB_00113105;
              }
LAB_0011310a:
              dVar22 = this->dz;
              iVar17 = iVar17 + 1;
            } while (iVar17 < (int)(z1 / dVar22) + -1);
            dVar21 = this->dy;
          }
          iVar17 = iVar1 + 1;
          iVar14 = (int)(local_b8 / dVar21);
          iVar20 = iVar1;
          iVar1 = iVar17;
        } while (iVar17 < iVar14 + -1);
      }
      uVar19 = (ulong)(iVar18 + 1U);
    } while (iVar18 + 1U != (uint)local_90);
  }
  return;
}

Assistant:

void spatial_region::film(double x0, double x1, double ne_y0, double ne_y1, int ions, double
        cmr, double gradwidth, double y0, double y1, double z0, double z1,
        double T, double vx, bool is_profiled,
        int xnpic_film, int ynpic_film, int znpic_film, bool append_for_moving_window, double gradwidth_y)
{ /* x0 - координата левой границы плёнки, x1 - правой, ne -
     концентрация электронов в плёнке, нормированная на критическую
     концентрацию */
    /* gradwidth - толщина части плёнки с линейным ростом плотности от
     * 0 на левой границе плёнки до ne при x0+gradwidth */
    /* при gradwidth<0 плотность плёнки линейно спадает от ne до 0 на
     * участке с градиентом */
    // if is_profiled == 1 then film has transverse envelope
    // ions == 0 - no ions, ions == 1 - use cmr, ions == 2 - positrons

    int_vector3d a,b;
    b.i = xnpic_film;
    b.j = ynpic_film;
    b.k = znpic_film;
    int i0,i1;
    i0 = x0/dx;
    i1 = x1/dx;

    if (append_for_moving_window)
    {
        i0 = nx-3;
        if (i0 < nx-2 && i1 >= nx-2)
        {
            i1 = nx-2;
        }
        else
        {
            i1 = i0; // the for loop is skipped
        }
    }
    else
    {
        if (i0<0) i0 = 0;
        if (i1<0) i1 = 0;
        if (i0>nx) i0 = nx;
        if (i1>nx) i1 = nx;
    }

    double film_ylen = double(int(y1/dy) - int(y0/dy) - 3);
    for(int i=i0;i<i1;i++)
    {
        for(int j=int(y0/dy)+1;j<int(y1/dy)-1;j++)
        {
            double nes = ne_y1 * (j - int(y0/dy) - 1) / film_ylen + ne_y0 * (int(y1/dy) - 2 - j) / film_ylen;
            for(int k=int(z0/dz)+1;k<int(z1/dz)-1;k++)
            {
                if (is_profiled == 1) {
                    double tmp = (j * dy - ny * dy / 2) / (ny * dy / 2);
                    tmp = cos(0.5 * PI * tmp * tmp * tmp * tmp * tmp);
                    double tr_env = tmp * tmp;
                    tmp =  (k * dz - nz * dz / 2) / (nz * dz / 2);
                    tmp = cos(0.5 * PI * tmp * tmp * tmp * tmp * tmp);
                    tr_env *= tmp * tmp;
                    nes *=  tr_env;
                }
                
                if (gradwidth_y >= 0 && j-int(y0/dy)-1 < gradwidth_y/dy) {
                    nes *= (j-int(y0/dy)-1) / (gradwidth_y/dy);
                }
                if (gradwidth_y >= 0 && int(y1/dy)-2-j < gradwidth_y/dy) {
                    nes *= (int(y1/dy)-2-j) / (gradwidth_y/dy);
                }
                //
                a.i = i;
                a.j = j;
                a.k = k;
                double ux0 = vx / sqrt(1 - vx * vx);
                if (gradwidth>=0) {
                    if (i>=int((x0+gradwidth)/dx))
                    {
                        fill_cell_by_particles(-1, a, b, nes, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes, ux0, 0, 0, T);
                    }
                    else
                    {
                        fill_cell_by_particles(-1, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T);
                    }
                } else {
                    if (i>=int((x0-gradwidth)/dx))
                    {
                        fill_cell_by_particles(-1, a, b, nes, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes, ux0, 0, 0, T);
                    }
                    else
                    {
                        fill_cell_by_particles(-1, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T);
                    }
                }
            }
        }
    }
}